

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O1

bool __thiscall
CNetBan::IsBanned(CNetBan *this,NETADDR_conflict *pAddr,char *pBuf,uint BufferSize,
                 int *pLastInfoQuery)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  CBan<NETADDR> *pBan;
  long lVar4;
  byte bVar5;
  long lVar6;
  CBan<CNetRange> *pBan_00;
  long in_FS_OFFSET;
  CNetHash aHash [17];
  undefined8 local_d0;
  CNetHash local_c8;
  uint auStack_c0 [34];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = 0x10;
  if (pAddr->type == 1) {
    lVar6 = 4;
  }
  local_c8.m_Hash = 0;
  local_c8.m_HashIndex = 0;
  bVar5 = 0;
  lVar4 = 0;
  do {
    bVar5 = bVar5 + pAddr->ip[lVar4];
    auStack_c0[lVar4 * 2] = (uint)bVar5;
    lVar1 = lVar4 + 1;
    auStack_c0[lVar4 * 2 + 1] = (int)lVar6 - 1U & (uint)lVar1;
    lVar4 = lVar1;
  } while (lVar6 != lVar1);
  pBan = CBanPool<NETADDR,_1>::Find(&this->m_BanAddrPool,pAddr,&local_c8 + lVar6);
  if (pBan == (CBan<NETADDR> *)0x0) {
    local_d0 = &this->m_BanRangePool;
    bVar2 = true;
    lVar4 = lVar6;
    do {
      for (pBan_00 = local_d0->m_paaHashList[*(int *)((long)&local_d0 + lVar4 * 8 + 4)]
                     [*(int *)(&local_d0 + lVar4)]; pBan_00 != (CBan<CNetRange> *)0x0;
          pBan_00 = pBan_00->m_pHashNext) {
        bVar3 = NetMatch(this,&pBan_00->m_Data,pAddr,(int)(lVar4 + -1),(int)lVar6);
        if (bVar3) {
          MakeBanInfo<CNetRange>(this,pBan_00,pBuf,BufferSize,0,pLastInfoQuery);
          goto LAB_001c6c4f;
        }
      }
      bVar2 = 1 < lVar4;
      bVar3 = 1 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar3);
  }
  else {
    MakeBanInfo<NETADDR>(this,pBan,pBuf,BufferSize,0,pLastInfoQuery);
    bVar2 = true;
  }
LAB_001c6c4f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CNetBan::IsBanned(const NETADDR *pAddr, char *pBuf, unsigned BufferSize, int *pLastInfoQuery)
{
	CNetHash aHash[17];
	int Length = CNetHash::MakeHashArray(pAddr, aHash);

	// check ban addresses
	CBanAddr *pBan = m_BanAddrPool.Find(pAddr, &aHash[Length]);
	if(pBan)
	{
		MakeBanInfo(pBan, pBuf, BufferSize, MSGTYPE_PLAYER, pLastInfoQuery);
		return true;
	}

	// check ban ranges
	for(int i = Length-1; i >= 0; --i)
	{
		for(CBanRange *pBan = m_BanRangePool.First(&aHash[i]); pBan; pBan = pBan->m_pHashNext)
		{
			if(NetMatch(&pBan->m_Data, pAddr, i, Length))
			{
				MakeBanInfo(pBan, pBuf, BufferSize, MSGTYPE_PLAYER, pLastInfoQuery);
				return true;
			}
		}
	}

	return false;
}